

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateMeasureUnitOption
               (MeasureUnit *measureUnit,UnicodeString *sb,UErrorCode *param_3)

{
  char *pcVar1;
  UnicodeString UStack_58;
  
  pcVar1 = MeasureUnit::getType(measureUnit);
  UnicodeString::UnicodeString(&UStack_58,pcVar1,-1,kInvariant);
  UnicodeString::append(sb,&UStack_58);
  UnicodeString::~UnicodeString(&UStack_58);
  UnicodeString::append(sb,L'-');
  pcVar1 = MeasureUnit::getSubtype(measureUnit);
  UnicodeString::UnicodeString(&UStack_58,pcVar1,-1,kInvariant);
  UnicodeString::append(sb,&UStack_58);
  UnicodeString::~UnicodeString(&UStack_58);
  return;
}

Assistant:

void blueprint_helpers::generateMeasureUnitOption(const MeasureUnit& measureUnit, UnicodeString& sb,
                                                  UErrorCode&) {
    // Need to do char <-> UChar conversion...
    sb.append(UnicodeString(measureUnit.getType(), -1, US_INV));
    sb.append(u'-');
    sb.append(UnicodeString(measureUnit.getSubtype(), -1, US_INV));
}